

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

bool __thiscall
rsg::anon_unknown_0::IsWritableIntersectingEntry::operator()
          (IsWritableIntersectingEntry *this,ValueEntry *entry)

{
  bool bVar1;
  Variable *this_00;
  VariableType *this_01;
  VariableType *other;
  bool local_31;
  ConstValueRangeAccess local_30;
  ValueEntry *local_18;
  ValueEntry *entry_local;
  IsWritableIntersectingEntry *this_local;
  
  local_18 = entry;
  entry_local = (ValueEntry *)this;
  bVar1 = IsWritableEntry::operator()((IsWritableEntry *)this,entry);
  local_31 = false;
  if (bVar1) {
    this_00 = ValueEntry::getVariable(local_18);
    this_01 = rsg::Variable::getType(this_00);
    other = ConstValueRangeAccess::getType(&this->m_valueRange);
    bVar1 = VariableType::operator==(this_01,other);
    local_31 = false;
    if (bVar1) {
      ValueEntry::getValueRange(&local_30,local_18);
      local_31 = ConstValueRangeAccess::intersects(&local_30,&this->m_valueRange);
    }
  }
  return local_31;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		return IsWritableEntry::operator()(entry) &&
			   entry->getVariable()->getType() == m_valueRange.getType() &&
			   entry->getValueRange().intersects(m_valueRange);
	}